

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void ImFontAtlasBuildPackCustomRects(ImFontAtlas *atlas,void *stbrp_context_opaque)

{
  long lVar1;
  int i;
  long lVar2;
  int i_1;
  int iVar3;
  long lVar4;
  ImVector<stbrp_rect> pack_rects;
  ImVector<stbrp_rect> local_28;
  
  local_28.Size = 0;
  local_28.Capacity = 0;
  local_28.Data = (stbrp_rect *)0x0;
  ImVector<stbrp_rect>::resize(&local_28,(atlas->CustomRects).Size);
  lVar4 = 0;
  memset(local_28.Data,0,(long)local_28.Size * 0x18);
  lVar1 = 0;
  for (lVar2 = 0; lVar2 < (atlas->CustomRects).Size; lVar2 = lVar2 + 1) {
    *(uint *)((long)&(local_28.Data)->w + lVar4) =
         (uint)*(ushort *)((long)&((atlas->CustomRects).Data)->Width + lVar1);
    *(uint *)((long)&(local_28.Data)->h + lVar4) =
         (uint)*(ushort *)((long)&((atlas->CustomRects).Data)->Height + lVar1);
    lVar1 = lVar1 + 0x20;
    lVar4 = lVar4 + 0x18;
  }
  stbrp_pack_rects((stbrp_context *)stbrp_context_opaque,local_28.Data,local_28.Size);
  lVar1 = 0;
  lVar2 = 0;
  for (lVar4 = 0; lVar4 < local_28.Size; lVar4 = lVar4 + 1) {
    if (*(int *)((long)&(local_28.Data)->was_packed + lVar2) != 0) {
      *(undefined2 *)((long)&((atlas->CustomRects).Data)->X + lVar1) =
           *(undefined2 *)((long)&(local_28.Data)->x + lVar2);
      *(undefined2 *)((long)&((atlas->CustomRects).Data)->Y + lVar1) =
           *(undefined2 *)((long)&(local_28.Data)->y + lVar2);
      iVar3 = *(int *)((long)&(local_28.Data)->h + lVar2) +
              *(int *)((long)&(local_28.Data)->y + lVar2);
      if (iVar3 < atlas->TexHeight) {
        iVar3 = atlas->TexHeight;
      }
      atlas->TexHeight = iVar3;
    }
    lVar2 = lVar2 + 0x18;
    lVar1 = lVar1 + 0x20;
  }
  ImVector<stbrp_rect>::~ImVector(&local_28);
  return;
}

Assistant:

void ImFontAtlasBuildPackCustomRects(ImFontAtlas* atlas, void* stbrp_context_opaque)
{
    stbrp_context* pack_context = (stbrp_context*)stbrp_context_opaque;
    IM_ASSERT(pack_context != NULL);

    ImVector<ImFontAtlasCustomRect>& user_rects = atlas->CustomRects;
    IM_ASSERT(user_rects.Size >= 1); // We expect at least the default custom rects to be registered, else something went wrong.

    ImVector<stbrp_rect> pack_rects;
    pack_rects.resize(user_rects.Size);
    memset(pack_rects.Data, 0, (size_t)pack_rects.size_in_bytes());
    for (int i = 0; i < user_rects.Size; i++)
    {
        pack_rects[i].w = user_rects[i].Width;
        pack_rects[i].h = user_rects[i].Height;
    }
    stbrp_pack_rects(pack_context, &pack_rects[0], pack_rects.Size);
    for (int i = 0; i < pack_rects.Size; i++)
        if (pack_rects[i].was_packed)
        {
            user_rects[i].X = (unsigned short)pack_rects[i].x;
            user_rects[i].Y = (unsigned short)pack_rects[i].y;
            IM_ASSERT(pack_rects[i].w == user_rects[i].Width && pack_rects[i].h == user_rects[i].Height);
            atlas->TexHeight = ImMax(atlas->TexHeight, pack_rects[i].y + pack_rects[i].h);
        }
}